

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_787a7::Pools::~Pools(Pools *this)

{
  pointer ppvVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  pointer ppuVar5;
  
  ppuVar5 = (this->chunks_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->chunks_).super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppuVar5) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      if (ppuVar5[uVar3] != (uchar *)0x0) {
        operator_delete__(ppuVar5[uVar3]);
      }
      ppuVar5 = (this->chunks_).
                super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar2 = uVar4 < (ulong)((long)(this->chunks_).
                                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppuVar5 >> 3)
      ;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar2);
  }
  if (ppuVar5 != (pointer)0x0) {
    operator_delete(ppuVar5);
  }
  ppvVar1 = (this->pools_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppvVar1 != (pointer)0x0) {
    operator_delete(ppvVar1);
    return;
  }
  return;
}

Assistant:

~Pools() {
            for(index_t i=0; i<chunks_.size(); ++i) {
                delete[] chunks_[i];
            }
        }